

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

uint64_t __thiscall kratos::HashVisitor::produce_hash(HashVisitor *this)

{
  pointer input;
  uint64_t uVar1;
  ulong seed;
  ulong *puVar2;
  
  uVar1 = hash_64_fnv1a((this->root_->name)._M_dataplus._M_p,(this->root_->name)._M_string_length);
  seed = uVar1 << 0x20;
  for (puVar2 = (this->var_hashes_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 != (this->var_hashes_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    seed = seed ^ *puVar2;
  }
  input = (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start;
  uVar1 = XXHash64::hash(input,(long)(this->stmt_hashes_).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)input,seed);
  return uVar1;
}

Assistant:

uint64_t produce_hash() {
        // use generator name as a seed
        uint64_t var_hash = hash_64_fnv1a(root_->name.c_str(), root_->name.size()) << 32u;
        for (const uint64_t var : var_hashes_) var_hash = var_hash ^ var;
        // use var_hash as a seed
        // FIXME: do we really need to hash in chunks? or can we use xor to ignore the ordering
        //  of the blocks?
        uint64_t result =
            XXHash64::hash(stmt_hashes_.data(), stmt_hashes_.size() * sizeof(uint64_t), var_hash);
        return result;
    }